

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O0

void __thiscall
fe::operations::op_unpremultipliedAlpha::operator()
          (op_unpremultipliedAlpha *this,PixelB8G8R8A8 *srcPixelFormat,PixelA8 *destPixelFormat,
          uchar *srcData,uchar *destData,int x,int y)

{
  byte bVar1;
  anon_union_4_3_3c41bd51_for_Pixel_0 local_38;
  int iStack_34;
  uchar na;
  Pixel p;
  int x_local;
  uchar *destData_local;
  uchar *srcData_local;
  PixelA8 *destPixelFormat_local;
  PixelB8G8R8A8 *srcPixelFormat_local;
  op_unpremultipliedAlpha *this_local;
  
  iStack_34 = x;
  _p = destData;
  PixelB8G8R8A8::getPixel(srcPixelFormat,srcData,(Pixel *)&local_38.field_0,x,y);
  bVar1 = PixelA8::snap_a(destPixelFormat,local_38.field_0.bytes[3]);
  if (bVar1 != 0) {
    local_38.field_0.bytes[0] =
         (uchar)((ulong)((uint)local_38.field_0.bytes[0] * 0xff) / (ulong)(long)(int)(uint)bVar1);
    local_38.field_0.bytes[1] =
         (uchar)((ulong)((uint)local_38.field_0.bytes[1] * 0xff) / (ulong)(long)(int)(uint)bVar1);
    local_38.field_0.bytes[2] =
         (uchar)((ulong)((uint)local_38.field_0.bytes[2] * 0xff) / (ulong)(long)(int)(uint)bVar1);
  }
  PixelA8::setPixel(destPixelFormat,_p,(Pixel *)&local_38.field_0);
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel p;
                srcPixelFormat.getPixel(srcData, p, OPERATOR_ARGS_PASS);

                //we need correct "snapped" to pixel format alpha
                unsigned char na = destPixelFormat.snap_a(p.a);

                if (na != 0)
                { 
                    p.r = (p.r * 255) / na;
                    p.g = (p.g * 255) / na;
                    p.b = (p.b * 255) / na;
                }
                

                destPixelFormat.setPixel(destData, p);
            }